

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_attack_aux_wand_bolt
                  (wchar_t sval,wchar_t rad,wchar_t dam,wchar_t typ,wchar_t selection)

{
  uint32_t uVar1;
  wchar_t wVar2;
  int iVar3;
  char *what;
  wchar_t local_28;
  wchar_t b_n;
  wchar_t i;
  wchar_t selection_local;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t rad_local;
  wchar_t sval_local;
  
  if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
    if (borg.trait[0x69] == 0) {
      rad_local = L'\0';
    }
    else if ((borg_simulate) && (uVar1 = Rand_div(100), (int)uVar1 < 2)) {
      rad_local = L'\0';
    }
    else {
      wVar2 = borg_slot(L'\x17',sval);
      if (wVar2 < L'\0') {
        rad_local = L'\0';
      }
      else if (borg_items[wVar2].pval == 0) {
        rad_local = L'\0';
      }
      else {
        iVar3 = borg_activate_failure(0x17,sval);
        if (iVar3 < 0x1f5) {
          local_28 = borg_launch_bolt(rad,dam,typ,(uint)z_info->max_range,L'\0');
          if (5 < borg.trait[0x23]) {
            local_28 = local_28 + L'\xfffffffb';
          }
          if ((sval == sv_wand_wonder) && ((borg.munchkin_mode & 1U) == 0)) {
            if ((local_28 < L'\x01') ||
               (wVar2 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false),
               wVar2 < (avoidance * 7) / 10)) {
              local_28 = L'\0';
            }
            else {
              local_28 = L'ϧ';
              what = format("# Emergency use of a Wand of Wonder.");
              borg_note(what);
            }
          }
          if ((borg_simulate & 1U) == 0) {
            borg_aim_wand(sval);
            borg_keypress(0x35);
            successful_target = L'\xffffffff';
            if (selection != L'\xffffffff') {
              borg_keypress(selection + L'b');
            }
            rad_local = local_28;
          }
          else {
            rad_local = local_28;
          }
        }
        else {
          rad_local = L'\0';
        }
      }
    }
  }
  else {
    rad_local = L'\0';
  }
  return rad_local;
}

Assistant:

static int borg_attack_aux_wand_bolt(
    int sval, int rad, int dam, int typ, int selection)
{
    int i;

    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Dont use wands in town, charges are too spendy */
    if (!borg.trait[BI_CDEPTH])
        return 0;

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 2))
        return 0;

    /* Look for that wand */
    i = borg_slot(TV_WAND, sval);

    /* None available */
    if (i < 0)
        return 0;

    /* No charges */
    if (!borg_items[i].pval)
        return 0;

    /* Not likely to be successful in the activation */
    if (500 < borg_activate_failure(TV_WAND, sval))
        return 0;

    /* Choose optimal location */
    b_n = borg_launch_bolt(rad, dam, typ, z_info->max_range, 0);

    /* Penalize charge usage */
    if (borg.trait[BI_CLEVEL] > 5)
        b_n = b_n - 5;

    /* Wands of wonder are used in last ditch efforts.  They behave
     * randomly, so the best use of them is an emergency.  I have seen
     * borgs die from hill orcs with fully charged wonder wands.  Odds
     * are he could have taken the orcs with the wand.  So use them in
     * an emergency after all the borg_caution() steps have failed
     */
    if (sval == sv_wand_wonder && !borg.munchkin_mode) {
        /* check the danger */
        if (b_n > 0
            && borg_danger(borg.c.y, borg.c.x, 1, true, false)
                   >= (avoidance * 7 / 10)) {
            /* make the wand appear deadly */
            b_n = 999;

            /* note the use of the wand in the emergency */
            borg_note(format("# Emergency use of a Wand of Wonder."));
        } else {
            b_n = 0;
        }
    }

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Aim the wand */
    (void)borg_aim_wand(sval);

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -1;

    /*  select the correct effect */
    if (selection != -1)
        borg_keypress('b' + selection);

    /* Value */
    return b_n;
}